

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyRepairDuplicateAttributes(TidyDocImpl *doc,Node *node,Bool isXml)

{
  TidyAttrId TVar1;
  TidyAttrId TVar2;
  TidyAllocator *pTVar3;
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  tmbstr ptVar9;
  AttVal *pAVar10;
  AttVal *classattr;
  char *str;
  AttVal *pAVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  
  pAVar11 = node->attributes;
LAB_0013ad0e:
  while( true ) {
    classattr = pAVar11;
    if (classattr == (AttVal *)0x0) {
      return;
    }
    if (classattr->asp != (Node *)0x0) break;
    pAVar11 = classattr->next;
    if (classattr->php == (Node *)0x0) {
      bVar12 = true;
LAB_0013ad36:
      do {
        if (pAVar11 == (AttVal *)0x0) goto LAB_0013b010;
        if ((pAVar11->asp == (Node *)0x0) && (pAVar11->php == (Node *)0x0)) {
          if ((classattr == (AttVal *)0x0) || (classattr->dict == (Attribute *)0x0)) {
            bVar13 = false;
          }
          else {
            bVar13 = classattr->dict->id != TidyAttr_UNKNOWN;
          }
          if (pAVar11->dict == (Attribute *)0x0) {
            bVar14 = false;
LAB_0013ada5:
            if (((((bool)(bVar13 | bVar14)) || (classattr->attribute == (ctmbstr)0x0)) ||
                (pAVar11->attribute == (ctmbstr)0x0)) ||
               (iVar6 = prvTidytmbstrcmp(classattr->attribute,pAVar11->attribute), iVar6 != 0))
            goto LAB_0013ad4f;
          }
          else {
            TVar1 = pAVar11->dict->id;
            bVar14 = TVar1 != TidyAttr_UNKNOWN;
            if (!(bool)(bVar13 & bVar14)) goto LAB_0013ada5;
            if (((classattr == (AttVal *)0x0) || (classattr->dict == (Attribute *)0x0)) ||
               ((TVar2 = classattr->dict->id, TVar2 == TidyAttr_UNKNOWN || (TVar2 != TVar1))))
            goto LAB_0013ad4f;
          }
          if ((isXml == no) && (classattr->dict != (Attribute *)0x0)) {
            TVar1 = classattr->dict->id;
            if (TVar1 == TidyAttr_STYLE) {
              if (((*(int *)((doc->config).value + 0x29) == 0) || (classattr->value == (ctmbstr)0x0)
                  ) || (str = pAVar11->value, str == (ctmbstr)0x0)) goto LAB_0013adce;
              uVar7 = prvTidytmbstrlen(classattr->value);
              ptVar9 = classattr->value;
              lVar5 = (long)uVar7;
              if (uVar7 == 0) {
LAB_0013af32:
                pTVar3 = doc->allocator;
                p_Var4 = pTVar3->vtbl->realloc;
                uVar8 = prvTidytmbstrlen(str);
                ptVar9 = (tmbstr)(*p_Var4)(pTVar3,ptVar9,lVar5 + (long)uVar8 + 3);
                classattr->value = ptVar9;
                if (uVar7 != 0) {
                  prvTidytmbstrcat(ptVar9,"; ");
                  ptVar9 = classattr->value;
                }
              }
              else if (ptVar9[uVar7 - 1] == '}') {
                pTVar3 = doc->allocator;
                p_Var4 = pTVar3->vtbl->realloc;
                uVar7 = prvTidytmbstrlen(str);
                ptVar9 = (tmbstr)(*p_Var4)(pTVar3,ptVar9,lVar5 + (long)uVar7 + 6);
                classattr->value = ptVar9;
                prvTidytmbstrcat(ptVar9," { ");
                prvTidytmbstrcat(classattr->value,str);
                ptVar9 = classattr->value;
                str = " }";
              }
              else {
                if (ptVar9[uVar7 - 1] != ';') goto LAB_0013af32;
                pTVar3 = doc->allocator;
                p_Var4 = pTVar3->vtbl->realloc;
                uVar7 = prvTidytmbstrlen(str);
                ptVar9 = (tmbstr)(*p_Var4)(pTVar3,ptVar9,lVar5 + (long)uVar7 + 2);
                classattr->value = ptVar9;
                prvTidytmbstrcat(ptVar9," ");
                ptVar9 = classattr->value;
              }
              prvTidytmbstrcat(ptVar9,str);
            }
            else {
              if (((TVar1 != TidyAttr_CLASS) || (*(int *)((doc->config).value + 0x28) == 0)) ||
                 ((classattr->value == (tmbstr)0x0 || (pAVar11->value == (ctmbstr)0x0))))
              goto LAB_0013adce;
              prvTidyAppendToClassAttr(doc,classattr,pAVar11->value);
            }
            pAVar10 = pAVar11->next;
            uVar7 = 0x24e;
          }
          else {
LAB_0013adce:
            if ((doc->config).value[0x12].v == 1) {
              pAVar10 = classattr->next;
              prvTidyReportAttrError(doc,node,classattr,0x272);
              prvTidyRemoveAttribute(doc,node,classattr);
              pAVar11 = pAVar11->next;
              bVar12 = false;
              classattr = pAVar10;
              goto LAB_0013ad36;
            }
            pAVar10 = pAVar11->next;
            uVar7 = 0x272;
          }
          prvTidyReportAttrError(doc,node,pAVar11,uVar7);
          prvTidyRemoveAttribute(doc,node,pAVar11);
          pAVar11 = pAVar10;
          goto LAB_0013ad36;
        }
LAB_0013ad4f:
        pAVar11 = pAVar11->next;
      } while( true );
    }
  }
  goto LAB_0013ad22;
LAB_0013b010:
  pAVar11 = classattr;
  if (bVar12) {
LAB_0013ad22:
    pAVar11 = classattr->next;
  }
  goto LAB_0013ad0e;
}

Assistant:

void TY_(RepairDuplicateAttributes)( TidyDocImpl* doc, Node *node, Bool isXml )
{
    AttVal *first;

    for (first = node->attributes; first != NULL;)
    {
        AttVal *second;
        Bool firstRedefined = no;

        if (!(first->asp == NULL && first->php == NULL))
        {
            first = first->next;
            continue;
        }

        for (second = first->next; second != NULL;)
        {
            AttVal *temp;

            if (!(second->asp == NULL && second->php == NULL
                  && AttrsHaveSameName(first, second)))
            {
                second = second->next;
                continue;
            }

            /* first and second attribute have same local name */
            /* now determine what to do with this duplicate... */

            if (!isXml
                && attrIsCLASS(first) && cfgBool(doc, TidyJoinClasses)
                && AttrHasValue(first) && AttrHasValue(second))
            {
                /* concatenate classes */

                TY_(AppendToClassAttr)(doc, first, second->value);

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if (!isXml
                     && attrIsSTYLE(first) && cfgBool(doc, TidyJoinStyles)
                     && AttrHasValue(first) && AttrHasValue(second))
            {
                AppendToStyleAttr( doc, first, second->value );

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if ( cfg(doc, TidyDuplicateAttrs) == TidyKeepLast )
            {
                temp = first->next;
                TY_(ReportAttrError)( doc, node, first, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, first );
                firstRedefined = yes;
                first = temp;
                second = second->next;
            }
            else /* TidyDuplicateAttrs == TidyKeepFirst */
            {
                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
        }
        if (!firstRedefined)
            first = first->next;
    }
}